

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_utility.hpp
# Opt level: O0

squall * __thiscall squall::get_type_text_abi_cxx11_(squall *this,SQObjectType t)

{
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d;
  allocator local_2c;
  allocator local_2b;
  allocator local_2a;
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  SQObjectType local_14;
  squall *psStack_10;
  SQObjectType t_local;
  
  local_14 = t;
  psStack_10 = this;
  if (t == OT_USERPOINTER) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"userpointer",&local_2e);
    std::allocator<char>::~allocator((allocator<char> *)&local_2e);
  }
  else if (t == OT_NULL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"null",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (t == OT_INTEGER) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"integer",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (t == OT_FLOAT) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"float",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else if (t == OT_STRING) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"string",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
  }
  else if (t == OT_ARRAY) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"array",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else if (t == OT_CLOSURE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"closurefunction",&local_2b);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b);
  }
  else if (t == OT_NATIVECLOSURE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"native closureC function",&local_2c);
    std::allocator<char>::~allocator((allocator<char> *)&local_2c);
  }
  else if (t == OT_GENERATOR) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"generator",&local_2d);
    std::allocator<char>::~allocator((allocator<char> *)&local_2d);
  }
  else if (t == OT_CLASS) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"class",&local_2f);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f);
  }
  else if (t == OT_WEAKREF) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"weak reference",&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  else if (t == OT_TABLE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"table",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
  }
  else if (t == OT_USERDATA) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"userdata",&local_2a);
    std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  }
  else if (t == OT_INSTANCE) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"instance",&local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_30);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"unknown",&local_32);
    std::allocator<char>::~allocator((allocator<char> *)&local_32);
  }
  return this;
}

Assistant:

inline
string get_type_text(SQObjectType t) {
    switch(t) {
        case OT_NULL:           return _SC("null");
        case OT_INTEGER:        return _SC("integer");
        case OT_FLOAT:          return _SC("float");
        case OT_STRING:         return _SC("string");
        case OT_TABLE:          return _SC("table");
        case OT_ARRAY:          return _SC("array");
        case OT_USERDATA:       return _SC("userdata");
        case OT_CLOSURE:        return _SC("closurefunction");
        case OT_NATIVECLOSURE:  return _SC("native closureC function");
        case OT_GENERATOR:      return _SC("generator");
        case OT_USERPOINTER:    return _SC("userpointer");
        case OT_CLASS:          return _SC("class");
        case OT_INSTANCE:       return _SC("instance");
        case OT_WEAKREF:        return _SC("weak reference");
        default:                return _SC("unknown");
    }
}